

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O3

void __thiscall QtMWidgets::Switch::mouseMoveEvent(Switch *this,QMouseEvent *event)

{
  SwitchPrivate *pSVar1;
  int iVar2;
  QPoint QVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  if (((this->d).d)->leftMouseButtonPressed != true) goto LAB_0016bbcc;
  dVar5 = (double)QEventPoint::position();
  pSVar1 = (this->d).d;
  iVar2 = (int)((double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_00177140) + dVar5) -
          (pSVar1->mousePos).xp;
  pSVar1->offset = pSVar1->offset + iVar2;
  iVar4 = -iVar2;
  if (0 < iVar2) {
    iVar4 = iVar2;
  }
  pSVar1->mouseMoveDelta = pSVar1->mouseMoveDelta + iVar4;
  auVar6 = QEventPoint::position();
  QVar3.xp = (int)((double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                  auVar6._0_8_);
  QVar3.yp = (int)((double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                  auVar6._8_8_);
  ((this->d).d)->mousePos = QVar3;
  pSVar1 = (this->d).d;
  if (pSVar1->offset < 0) {
    iVar4 = 0;
LAB_0016bbc1:
    pSVar1->offset = iVar4;
  }
  else {
    iVar4 = ~*(uint *)(*(long *)&this->field_0x20 + 0x14) +
            *(int *)(*(long *)&this->field_0x20 + 0x1c) + pSVar1->radius * -2;
    if (iVar4 < pSVar1->offset) goto LAB_0016bbc1;
  }
  QWidget::update();
LAB_0016bbcc:
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void
Switch::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		const int delta = event->pos().x() - d->mousePos.x();
		d->offset += delta;
		d->mouseMoveDelta += qAbs( delta );
		d->mousePos = event->pos();

		if( d->offset < 0 )
			d->offset = 0;
		else if( d->offset > rect().width() - d->radius * 2 - 2 )
			d->offset = rect().width() - d->radius * 2 - 2;

		update();
	}

	event->accept();
}